

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMLeaf.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::CMLeaf::CMLeaf
          (CMLeaf *this,QName *element,uint position,bool adopt,uint maxStates,
          MemoryManager *manager)

{
  QName *this_00;
  
  (this->super_CMNode).fMemoryManager = manager;
  (this->super_CMNode).fType = Leaf;
  (this->super_CMNode).fFirstPos = (CMStateSet *)0x0;
  (this->super_CMNode).fLastPos = (CMStateSet *)0x0;
  (this->super_CMNode).fMaxStates = maxStates;
  (this->super_CMNode).fIsNullable = false;
  (this->super_CMNode)._vptr_CMNode = (_func_int **)&PTR__CMLeaf_00404e60;
  this->fElement = (QName *)0x0;
  this->fPosition = position;
  this->fAdopt = adopt;
  if (element == (QName *)0x0) {
    this_00 = (QName *)XMemory::operator_new(0x48,manager);
    QName::QName(this_00,L"",L"",0xfffffffe,(this->super_CMNode).fMemoryManager);
    this->fElement = this_00;
    this->fAdopt = true;
    position = this->fPosition;
  }
  else {
    this->fElement = element;
  }
  (this->super_CMNode).fIsNullable = position == 0xfffffffe;
  return;
}

Assistant:

inline CMLeaf::CMLeaf( QName* const         element
                     , unsigned int         position
                     , bool                 adopt
                     , unsigned int         maxStates
                     , MemoryManager* const manager) :
    CMNode(ContentSpecNode::Leaf, maxStates, manager)
    , fElement(0)
    , fPosition(position)
    , fAdopt(adopt)
{
    if (!element)
    {
        fElement = new (fMemoryManager) QName
        (
              XMLUni::fgZeroLenString
            , XMLUni::fgZeroLenString
            , XMLElementDecl::fgInvalidElemId
            , fMemoryManager
        );
        // We have to be responsible for this QName - override adopt parameter
        fAdopt = true;
    }
    else
    {
        fElement = element;
    }
    // Leaf nodes are never nullable unless its an epsilon node
    fIsNullable=(fPosition == epsilonNode);
}